

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase1050::run(TestCase1050 *this)

{
  SourceLocation location;
  undefined4 uVar1;
  FiberBase *node;
  bool bVar2;
  int extraout_EAX;
  uint uVar3;
  size_t sVar4;
  void *pvVar5;
  uint extraout_var;
  size_t sVar6;
  Fiber<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1018:9)>
  *ptrCopy;
  WaitScope waitScope;
  Fault f_2;
  int setStackSizeRetval;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1027:3)>
  _kjDefer1027;
  pthread_t thread;
  pthread_attr_t attr;
  undefined1 local_120 [24];
  size_t sStack_108;
  bool local_100;
  Fault local_f8;
  int local_ec;
  FiberBase *local_e8;
  anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1027:3)>_2
  local_e0;
  Fault local_d8;
  size_t local_d0;
  char *local_c8;
  char *pcStack_c0;
  undefined8 local_b8;
  size_t local_b0;
  pthread_attr_t local_a8 [2];
  
  sVar4 = __sysconf(0x4b);
  sVar6 = 0x40000;
  if ((long)sVar4 < 0x40000) {
    sVar6 = sVar4;
  }
  local_d0 = 0x4000;
  if (0x4000 < (long)sVar6) {
    local_d0 = sVar6;
  }
  local_b0 = local_d0;
  bVar2 = isLibcContextHandlingKnownBroken();
  if (!bVar2) {
    EventLoop::EventLoop((EventLoop *)local_a8);
    local_120._8_4_ = 0xffffffff;
    local_120._16_8_ = (char *)0x0;
    sStack_108 = 0;
    local_120._0_8_ = local_a8;
    EventLoop::enterScope((EventLoop *)local_a8);
    sVar6 = local_d0;
    local_c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_c0 = "runWithStackLimit";
    local_b8 = 0x5000003f9;
    pvVar5 = operator_new(0x400);
    *(undefined ***)((long)pvVar5 + 0x1d8) = &PTR_destroy_00627c78;
    *(undefined **)((long)pvVar5 + 0x1e8) = &DAT_00627cc8;
    location.function = pcStack_c0;
    location.fileName = local_c8;
    location.lineNumber = (undefined4)local_b8;
    location.columnNumber = local_b8._4_4_;
    kj::_::FiberBase::FiberBase
              ((FiberBase *)((long)pvVar5 + 0x1d8),sVar6,(ExceptionOrValue *)((long)pvVar5 + 0x260),
               location);
    *(undefined ***)((long)pvVar5 + 0x1d8) = &PTR_destroy_00627c78;
    *(undefined **)((long)pvVar5 + 0x1e8) = &DAT_00627cc8;
    *(size_t **)((long)pvVar5 + 600) = &local_b0;
    *(undefined1 *)((long)pvVar5 + 0x260) = 0;
    *(undefined1 *)((long)pvVar5 + 0x3f8) = 0;
    *(void **)((long)pvVar5 + 0x1e0) = pvVar5;
    kj::_::Event::armDepthFirst((Event *)((long)pvVar5 + 0x1e8));
    local_c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_c0 = "runWithStackLimit";
    local_b8 = 0x5000003f9;
    local_e8 = (FiberBase *)((long)pvVar5 + 0x1d8);
    Promise<void>::wait((Promise<void> *)&local_e8,local_120);
    node = local_e8;
    if ((Exception *)local_e8 != (Exception *)0x0) {
      local_e8 = (FiberBase *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
    if ((char *)local_120._16_8_ == (char *)0x0) {
      EventLoop::leaveScope((EventLoop *)local_120._0_8_);
    }
    EventLoop::~EventLoop((EventLoop *)local_a8);
  }
  local_120._4_4_ = pthread_attr_init(local_a8);
  local_120._0_4_ = 0;
  uVar1 = local_120._0_4_;
  local_120._0_4_ = 0;
  local_120._8_8_ = " == ";
  local_120._16_8_ = &DAT_00000005;
  sStack_108 = CONCAT71(sStack_108._1_7_,local_120._4_4_ == 0);
  if (local_120._4_4_ != 0) {
    local_120._0_4_ = uVar1;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&>
              ((Fault *)&local_e8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x402,FAILED,"0 == pthread_attr_init(&attr)","_kjCondition,",
               (DebugComparison<int,_int> *)local_120);
    kj::_::Debug::Fault::fatal((Fault *)&local_e8);
  }
  local_e8 = (FiberBase *)CONCAT71(local_e8._1_7_,1);
  local_e0 = (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1027:3)>_2
              )local_a8;
  local_ec = pthread_attr_setstacksize(local_a8,local_d0);
  if (local_ec == 0x16) {
    if (kj::_::Debug::minSeverity < 2) {
      __sysconf(0x4b);
      local_120._0_4_ = extraout_EAX;
      local_120._4_4_ = extraout_var;
      kj::_::Debug::log<char_const(&)[128],unsigned_long&,long,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x409,WARNING,
                 "\"This platform\'s pthread implementation does not support setting a small stack size. \" \"Skipping pthread-based stack overflow test.\", stackSize, PTHREAD_STACK_MIN, setStackSizeRetval"
                 ,(char (*) [128])
                  "This platform\'s pthread implementation does not support setting a small stack size. Skipping pthread-based stack overflow test."
                 ,&local_d0,(long *)local_120,&local_ec);
    }
  }
  else {
    local_120._0_8_ = (ulong)(uint)local_120._4_4_ << 0x20;
    local_120._8_8_ = &local_ec;
    local_120._16_8_ = " == ";
    sStack_108 = 5;
    local_100 = local_ec == 0;
    if (!local_100) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int,int&>&>
                (&local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x40b,FAILED,"0 == setStackSizeRetval","_kjCondition,",
                 (DebugComparison<int,_int_&> *)local_120);
      kj::_::Debug::Fault::fatal(&local_d8);
    }
    uVar3 = pthread_create((pthread_t *)&local_d8,local_a8,
                           runWithStackLimit<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1053:32)>
                           ::anon_class_1_0_00000001::__invoke,&local_b0);
    local_120._0_8_ = (ulong)uVar3 << 0x20;
    local_120._8_8_ = " == ";
    local_120._16_8_ = &DAT_00000005;
    bVar2 = uVar3 == 0;
    sStack_108._0_1_ = bVar2;
    if (!bVar2) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&>
                (&local_f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x414,FAILED,
                 "0 == pthread_create(&thread, &attr, start, reinterpret_cast<void*>(&func))",
                 "_kjCondition,",(DebugComparison<int,_int> *)local_120);
      kj::_::Debug::Fault::fatal(&local_f8);
    }
    local_120._4_4_ = pthread_join((pthread_t)local_d8.exception,(void **)0x0);
    local_120._0_4_ = 0;
    local_120._8_8_ = " == ";
    local_120._16_8_ = &DAT_00000005;
    sStack_108 = CONCAT71(sStack_108._1_7_,local_120._4_4_ == 0);
    if (local_120._4_4_ != 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&>
                (&local_f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x415,FAILED,"0 == pthread_join(thread, nullptr)","_kjCondition,",
                 (DebugComparison<int,_int> *)local_120);
      kj::_::Debug::Fault::fatal(&local_f8);
    }
  }
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1027:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1027:3)>
               *)&local_e8);
  return;
}

Assistant:

inline size_t getSmallStackSize() {
#if !_WIN32
  // pthread_attr_setstacksize() requires a stack size of at least PTHREAD_STACK_MIN, which can
  // vary by platform.  We'll clamp that to a reasonable range for stack overflow tests, and skip
  // the pthread-based tests if we can't get it.
  return kj::max(16 * 1024, kj::min(256 * 1024, PTHREAD_STACK_MIN));
#else
  return 16 * 1024;
#endif
}